

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

void Imf_2_5::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  char cVar1;
  byte bVar2;
  ushort *puVar3;
  ushort uVar4;
  uint uVar5;
  size_t i;
  float *pfVar6;
  uint *puVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  char *pcVar10;
  char *pcVar11;
  ArgExc *this;
  long lVar12;
  half hVar13;
  undefined3 in_register_00000081;
  size_t __n;
  float i_00;
  uchar b [4];
  float local_2c;
  
  if (CONCAT31(in_register_00000081,fill) == 0) {
    if (format == XDR) {
      if (typeInFrameBuffer == FLOAT) {
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            pcVar11 = *readPtr;
            do {
              lVar12 = 0;
              pcVar10 = pcVar11;
              do {
                pcVar11 = pcVar10 + 1;
                *readPtr = pcVar11;
                *(char *)((long)&local_2c + lVar12) = *pcVar10;
                lVar12 = lVar12 + 1;
                pcVar10 = pcVar11;
              } while ((int)lVar12 != 4);
              *(float *)writePtr = (float)(uint)local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            pbVar8 = (byte *)(*readPtr + 1);
            do {
              *readPtr = (char *)pbVar8;
              bVar2 = pbVar8[-1];
              *readPtr = (char *)(pbVar8 + 1);
              *(undefined4 *)writePtr =
                   *(undefined4 *)
                    ((long)half::_toFloat + (ulong)((uint)*pbVar8 * 0x400 + (uint)bVar2 * 4));
              writePtr = writePtr + xStride;
              pbVar8 = pbVar8 + 2;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) goto LAB_001d4de2;
          if (writePtr <= endPtr) {
            pcVar11 = *readPtr;
            do {
              lVar12 = 0;
              pcVar10 = pcVar11;
              do {
                pcVar11 = pcVar10 + 1;
                *readPtr = pcVar11;
                *(char *)((long)&local_2c + lVar12) = *pcVar10;
                lVar12 = lVar12 + 1;
                pcVar10 = pcVar11;
              } while ((int)lVar12 != 4);
              *(float *)writePtr = local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
      }
      else if (typeInFrameBuffer == HALF) {
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar12 = 0;
            pcVar11 = *readPtr;
            do {
              *readPtr = pcVar11 + 1;
              *(char *)((long)&local_2c + lVar12) = *pcVar11;
              lVar12 = lVar12 + 1;
              pcVar11 = pcVar11 + 1;
            } while ((int)lVar12 != 4);
            hVar13 = uintToHalf((uint)local_2c);
            *(unsigned_short *)writePtr = hVar13._h;
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            pcVar11 = *readPtr + 1;
            do {
              *readPtr = pcVar11;
              cVar1 = pcVar11[-1];
              *readPtr = pcVar11 + 1;
              *(ushort *)writePtr = CONCAT11(*pcVar11,cVar1);
              writePtr = writePtr + xStride;
              pcVar11 = pcVar11 + 2;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) goto LAB_001d4de2;
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar12 = 0;
            pcVar11 = *readPtr;
            do {
              *readPtr = pcVar11 + 1;
              *(char *)((long)&local_2c + lVar12) = *pcVar11;
              lVar12 = lVar12 + 1;
              pcVar11 = pcVar11 + 1;
            } while ((int)lVar12 != 4);
            hVar13 = floatToHalf(local_2c);
            *(unsigned_short *)writePtr = hVar13._h;
          }
        }
      }
      else {
        if (typeInFrameBuffer != UINT) {
LAB_001d4de2:
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
          __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            pcVar11 = *readPtr;
            do {
              lVar12 = 0;
              pcVar10 = pcVar11;
              do {
                pcVar11 = pcVar10 + 1;
                *readPtr = pcVar11;
                *(char *)((long)&local_2c + lVar12) = *pcVar10;
                lVar12 = lVar12 + 1;
                pcVar10 = pcVar11;
              } while ((int)lVar12 != 4);
              *(float *)writePtr = local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            pcVar11 = *readPtr;
            *readPtr = pcVar11 + 1;
            cVar1 = *pcVar11;
            *readPtr = pcVar11 + 2;
            hVar13._h._1_1_ = pcVar11[1];
            hVar13._h._0_1_ = cVar1;
            uVar5 = halfToUint(hVar13);
            *(uint *)writePtr = uVar5;
          }
        }
        else {
          if (typeInFile != FLOAT) goto LAB_001d4de2;
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar12 = 0;
            pcVar11 = *readPtr;
            do {
              *readPtr = pcVar11 + 1;
              *(char *)((long)&local_2c + lVar12) = *pcVar11;
              lVar12 = lVar12 + 1;
              pcVar11 = pcVar11 + 1;
            } while ((int)lVar12 != 4);
            uVar5 = floatToUint(local_2c);
            *(uint *)writePtr = uVar5;
          }
        }
      }
    }
    else if (typeInFrameBuffer == FLOAT) {
      if (typeInFile == UINT) {
        if (writePtr <= endPtr) {
          puVar7 = (uint *)*readPtr;
          do {
            *(float *)writePtr = (float)*puVar7;
            *readPtr = (char *)(puVar7 + 1);
            writePtr = (char *)((long)writePtr + xStride);
            puVar7 = puVar7 + 1;
          } while (writePtr <= endPtr);
        }
      }
      else if (typeInFile == HALF) {
        if (writePtr <= endPtr) {
          puVar3 = (ushort *)*readPtr;
          do {
            *(uif *)writePtr = half::_toFloat[*puVar3];
            *readPtr = (char *)(puVar3 + 1);
            writePtr = (char *)((long)writePtr + xStride);
            puVar3 = puVar3 + 1;
          } while (writePtr <= endPtr);
        }
      }
      else {
        if (typeInFile != FLOAT) goto LAB_001d4de2;
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar12 = 0;
          do {
            writePtr[lVar12] = (*readPtr)[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          *readPtr = *readPtr + 4;
        }
      }
    }
    else if (typeInFrameBuffer == HALF) {
      if (typeInFile == UINT) {
        if (writePtr <= endPtr) {
          puVar7 = (uint *)*readPtr;
          do {
            hVar13 = uintToHalf(*puVar7);
            *(unsigned_short *)writePtr = hVar13._h;
            puVar7 = (uint *)(*readPtr + 4);
            *readPtr = (char *)puVar7;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
      else if (typeInFile == HALF) {
        if (xStride == 2) {
          __n = (size_t)(((int)endPtr - (int)writePtr) + 2);
          memcpy(writePtr,*readPtr,__n);
          pcVar11 = *readPtr + __n;
        }
        else {
          if (endPtr < writePtr) {
            return;
          }
          pcVar11 = *readPtr;
          do {
            *(undefined2 *)writePtr = *(undefined2 *)pcVar11;
            pcVar11 = pcVar11 + 2;
            writePtr = writePtr + xStride;
          } while (writePtr <= endPtr);
        }
        *readPtr = pcVar11;
      }
      else {
        if (typeInFile != FLOAT) goto LAB_001d4de2;
        if (writePtr <= endPtr) {
          pfVar6 = (float *)*readPtr;
          do {
            hVar13 = floatToHalf(*pfVar6);
            *(unsigned_short *)writePtr = hVar13._h;
            pfVar6 = (float *)(*readPtr + 4);
            *readPtr = (char *)pfVar6;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
    }
    else {
      if (typeInFrameBuffer != UINT) goto LAB_001d4de2;
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar12 = 0;
          do {
            writePtr[lVar12] = (*readPtr)[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        if (writePtr <= endPtr) {
          puVar9 = (unsigned_short *)*readPtr;
          do {
            uVar5 = halfToUint((half)*puVar9);
            *(uint *)writePtr = uVar5;
            puVar9 = (unsigned_short *)(*readPtr + 2);
            *readPtr = (char *)puVar9;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
      else {
        if (typeInFile != FLOAT) goto LAB_001d4de2;
        if (writePtr <= endPtr) {
          pfVar6 = (float *)*readPtr;
          do {
            uVar5 = floatToUint(*pfVar6);
            *(uint *)writePtr = uVar5;
            pfVar6 = (float *)(*readPtr + 4);
            *readPtr = (char *)pfVar6;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
    }
  }
  else if (typeInFrameBuffer == FLOAT) {
    if (writePtr <= endPtr) {
      do {
        *(float *)writePtr = (float)fillValue;
        writePtr = (char *)((long)writePtr + xStride);
      } while (writePtr <= endPtr);
    }
  }
  else if (typeInFrameBuffer == HALF) {
    i_00 = (float)fillValue;
    if ((i_00 != 0.0) || (NAN(i_00))) {
      if (half::_eLut[(uint)i_00 >> 0x17] == 0) {
        uVar4 = half::convert((int)i_00);
        uVar5 = (uint)uVar4;
      }
      else {
        uVar5 = (uint)half::_eLut[(uint)i_00 >> 0x17] +
                (((uint)i_00 & 0x7fffff) + 0xfff + (uint)(((uint)i_00 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar5 = (uint)i_00 >> 0x10;
    }
    for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
      *(short *)writePtr = (short)uVar5;
    }
  }
  else {
    if (typeInFrameBuffer != UINT) goto LAB_001d4de2;
    if (writePtr <= endPtr) {
      do {
        *(int *)writePtr = (int)(long)fillValue;
        writePtr = writePtr + xStride;
      } while (writePtr <= endPtr);
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (const char *& readPtr,
		     char * writePtr,
		     char * endPtr,
                     size_t xStride,
		     bool fill,
		     double fillValue,
                     Compressor::Format format,
                     PixelType typeInFrameBuffer,
                     PixelType typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
	  case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
            
            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float *) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(unsigned int *) writePtr);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h;
                    Xdr::read <CharPtrIO> (readPtr, h);
                    *(unsigned int *) writePtr = halfToUint (h);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;
                    Xdr::read <CharPtrIO> (readPtr, f);
                    *(unsigned int *)writePtr = floatToUint (f);
                    writePtr += xStride;
                }
                break;
                
              default:                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;
                    Xdr::read <CharPtrIO> (readPtr, ui);
                    *(half *) writePtr = uintToHalf (ui);
                    writePtr += xStride;
                }
                break;
                
              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(half *) writePtr);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;
                    Xdr::read <CharPtrIO> (readPtr, f);
                    *(half *) writePtr = floatToHalf (f);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;
                    Xdr::read <CharPtrIO> (readPtr, ui);
                    *(float *) writePtr = float (ui);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h;
                    Xdr::read <CharPtrIO> (readPtr, h);
                    *(float *) writePtr = float (h);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    Xdr::read <CharPtrIO> (readPtr, *(float *) writePtr);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        writePtr[i] = readPtr[i];

                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h = *(half *) readPtr;
                    *(unsigned int *) writePtr = halfToUint (h);
                    readPtr += sizeof (half);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;

                    for (size_t i = 0; i < sizeof (float); ++i)
                        ((char *)&f)[i] = readPtr[i];

                    *(unsigned int *)writePtr = floatToUint (f);
                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
                
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;

                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        ((char *)&ui)[i] = readPtr[i];

                    *(half *) writePtr = uintToHalf (ui);
                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                // If we're tightly packed, just memcpy
                if (xStride == sizeof(half)) {
                    int numBytes = endPtr-writePtr+sizeof(half);
                    memcpy(writePtr, readPtr, numBytes);
                    readPtr  += numBytes;
                    writePtr += numBytes;                    
                } else {
                    while (writePtr <= endPtr)
                    {
                        *(half *) writePtr = *(half *)readPtr;
                        readPtr += sizeof (half);
                        writePtr += xStride;
                    }
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    float f;

                    for (size_t i = 0; i < sizeof (float); ++i)
                        ((char *)&f)[i] = readPtr[i];

                    *(half *) writePtr = floatToHalf (f);
                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            switch (typeInFile)
            {
              case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (writePtr <= endPtr)
                {
                    unsigned int ui;

                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        ((char *)&ui)[i] = readPtr[i];

                    *(float *) writePtr = float (ui);
                    readPtr += sizeof (unsigned int);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (writePtr <= endPtr)
                {
                    half h = *(half *) readPtr;
                    *(float *) writePtr = float (h);
                    readPtr += sizeof (half);
                    writePtr += xStride;
                }
                break;

              case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (writePtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (float); ++i)
                        writePtr[i] = readPtr[i];

                    readPtr += sizeof (float);
                    writePtr += xStride;
                }
                break;
              default:
                  
                  throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}